

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_ProtoParseError_Test::
EncodeDecodeTest_ProtoParseError_Test(EncodeDecodeTest_ProtoParseError_Test *this)

{
  EncodeDecodeTest_ProtoParseError_Test *this_local;
  
  EncodeDecodeTest::EncodeDecodeTest(&this->super_EncodeDecodeTest);
  (this->super_EncodeDecodeTest).
  super_TestWithParam<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  super_Test._vptr_Test = (_func_int **)&PTR__EncodeDecodeTest_ProtoParseError_Test_029ff6a8;
  (this->super_EncodeDecodeTest).
  super_TestWithParam<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  super_WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  _vptr_WithParamInterface = (_func_int **)&PTR__EncodeDecodeTest_ProtoParseError_Test_029ff6e8;
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, ProtoParseError) {
  EXPECT_FALSE(
      Run("net/proto2/internal/no_such_file.proto "
          "--encode=NoSuchType"));
  ExpectStdoutMatchesText("");
  ExpectErrorSubstring(
      "net/proto2/internal/no_such_file.proto: "
      "No such file or directory");
}